

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Element
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,RegSlot Element,
          bool instanceAtReturnRegOK,bool forceStrictMode)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpCode local_2e;
  ProfileId local_2c;
  byte local_29;
  bool success;
  OpLayoutType OStack_28;
  OpCode newop;
  ProfileId profileId;
  byte local_22;
  bool isProfiledLayout;
  RegSlot local_20;
  bool forceStrictMode_local;
  RegSlot RStack_1c;
  bool instanceAtReturnRegOK_local;
  RegSlot Element_local;
  RegSlot Instance_local;
  RegSlot Value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_22 = forceStrictMode;
  isProfiledLayout = instanceAtReturnRegOK;
  local_20 = Element;
  RStack_1c = Instance;
  Element_local = Value;
  Instance_local._2_2_ = op;
  _Value_local = this;
  CheckOpen(this);
  op_00 = Instance_local._2_2_;
  OpLayoutType::OpLayoutType(&stack0xffffffffffffffd8,ElementI);
  CheckOp(this,op_00,OStack_28);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(Instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x556,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Element_local = ConsumeReg(this,Element_local);
  RStack_1c = ConsumeReg(this,RStack_1c);
  local_20 = ConsumeReg(this,local_20);
  bVar2 = ParseableFunctionInfo::GetIsStrictMode
                    (&this->m_functionWrite->super_ParseableFunctionInfo);
  if (((bVar2) || ((local_22 & 1) != 0)) && (Instance_local._2_2_ == DeleteElemI_A)) {
    Instance_local._2_2_ = DeleteElemIStrict_A;
  }
  local_29 = 0;
  local_2c = 0xffff;
  if (((isProfiledLayout & 1U) == 0) && (RStack_1c == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x566,"(instanceAtReturnRegOK || Instance != 0)",
                                "instanceAtReturnRegOK || Instance != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
  if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) ||
     ((bVar2 = DoDynamicProfileOpcode(this,TypedArrayTypeSpecPhase,false), bVar2 ||
      (bVar2 = DoDynamicProfileOpcode(this,ArrayCheckHoistPhase,false), bVar2)))) {
    if (Instance_local._2_2_ == LdElemI_A) {
      bVar2 = FunctionBody::AllocProfiledLdElemId(this->m_functionWrite,&local_2c);
      if (bVar2) {
        local_29 = 1;
        Instance_local._2_2_ = ProfiledLdElemI_A;
      }
    }
    else {
      if (Instance_local._2_2_ == StElemI_A) {
        local_2e = ProfiledStElemI_A;
      }
      else {
        if (Instance_local._2_2_ != StElemI_A_Strict) goto LAB_00c2ea89;
        local_2e = ProfiledStElemI_A_Strict;
      }
      bVar2 = FunctionBody::AllocProfiledStElemId(this->m_functionWrite,&local_2c);
      if (bVar2) {
        local_29 = 1;
        Instance_local._2_2_ = local_2e;
      }
    }
  }
LAB_00c2ea89:
  bVar2 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,Instance_local._2_2_,Element_local,RStack_1c,local_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,Instance_local._2_2_,Element_local,RStack_1c,local_20), !bVar2)) &&
     (bVar2 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,Instance_local._2_2_,Element_local,RStack_1c,local_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x588,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((local_29 & 1) != 0) {
    if (local_2c == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x58b,"(profileId != Js::Constants::NoProfileId)",
                                  "profileId != Js::Constants::NoProfileId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Data::Encode(&this->m_byteCodeData,&local_2c,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Element(OpCode op, RegSlot Value, RegSlot Instance, RegSlot Element, bool instanceAtReturnRegOK, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementI);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);
        Element = ConsumeReg(Element);

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteElemI_A)
            {
                op = OpCode::DeleteElemIStrict_A;
            }
        }

        bool isProfiledLayout = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Assert(instanceAtReturnRegOK || Instance != 0);
        if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
            DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
            DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
            DoDynamicProfileOpcode(ArrayCheckHoistPhase))
        {
            OpCode newop;
            switch (op)
            {
            case OpCode::LdElemI_A:
                newop = OpCode::ProfiledLdElemI_A;
                if (this->m_functionWrite->AllocProfiledLdElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;

            case Js::OpCode::StElemI_A:
                newop = OpCode::ProfiledStElemI_A;
                goto StoreCommon;

            case Js::OpCode::StElemI_A_Strict:
                newop = OpCode::ProfiledStElemI_A_Strict;
StoreCommon:
                if (this->m_functionWrite->AllocProfiledStElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementI, op, Value, Instance, Element);
        if (isProfiledLayout)
        {
            Assert(profileId != Js::Constants::NoProfileId);
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }